

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigVec.c
# Opt level: O0

int Fraig_NodeVecPushUniqueOrder(Fraig_NodeVec_t *p,Fraig_Node_t *pNode)

{
  int local_24;
  int i;
  Fraig_Node_t *pNode_local;
  Fraig_NodeVec_t *p_local;
  
  local_24 = 0;
  while( true ) {
    if (p->nSize <= local_24) {
      Fraig_NodeVecPushOrder(p,pNode);
      return 0;
    }
    if (p->pArray[local_24] == pNode) break;
    local_24 = local_24 + 1;
  }
  return 1;
}

Assistant:

int Fraig_NodeVecPushUniqueOrder( Fraig_NodeVec_t * p, Fraig_Node_t * pNode )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == pNode )
            return 1;
    Fraig_NodeVecPushOrder( p, pNode );
    return 0;
}